

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Gluco::OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>::
clean(OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted> *this,
     Lit *idx)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  vec<Gluco::Solver::Watcher> *this_00;
  
  this_00 = (this->occs).data + idx->x;
  lVar3 = 0;
  iVar5 = 0;
  for (lVar4 = 0; lVar4 < this_00->sz; lVar4 = lVar4 + 1) {
    bVar1 = Solver::WatcherDeleted::operator()
                      (&this->deleted,(Watcher *)((long)&this_00->data->cref + lVar3));
    if (!bVar1) {
      lVar2 = (long)iVar5;
      iVar5 = iVar5 + 1;
      this_00->data[lVar2] = this_00->data[lVar4];
    }
    lVar3 = lVar3 + 8;
  }
  vec<Gluco::Solver::Watcher>::shrink(this_00,(int)lVar4 - iVar5);
  (this->dirty).data[idx->x] = '\0';
  return;
}

Assistant:

void OccLists<Idx,Vec,Deleted>::clean(const Idx& idx)
{
    Vec& vec = occs[toInt(idx)];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[toInt(idx)] = 0;
}